

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

IRType crec_ct2irt(CTState *cts,CType *ct)

{
  uint uVar1;
  uint uVar2;
  IRType IVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar5 = ct->info;
  if ((uVar5 & 0xf0000000) == 0x50000000) {
    uVar4 = (ulong)((uVar5 & 0xffff) << 4);
    ct = (CType *)((long)&cts->tab->info + uVar4);
    uVar5 = *(uint *)((long)&cts->tab->info + uVar4);
  }
  if (uVar5 < 0x10000000) {
    uVar1 = ct->size;
    if ((uVar5 >> 0x1a & 1) == 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      if (3 < uVar2) {
        return IRT_CDATA;
      }
      return (uVar5 >> 0x17 & 1) + uVar2 * 2 + IRT_I8;
    }
    bVar6 = uVar1 == 4;
    bVar7 = uVar1 == 8;
  }
  else {
    if ((uVar5 & 0xf0000000) == 0x20000000) {
      return (uint)(ct->size == 8) * 4 + IRT_P32;
    }
    if ((uVar5 & 0xf4000000) != 0x34000000) {
      return IRT_CDATA;
    }
    bVar6 = ct->size == 8;
    bVar7 = ct->size == 0x10;
  }
  IVar3 = IRT_NUM;
  if (!bVar7) {
    IVar3 = (uint)bVar6 * 3 + IRT_CDATA;
  }
  return IVar3;
}

Assistant:

static IRType crec_ct2irt(CTState *cts, CType *ct)
{
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (LJ_LIKELY(ctype_isnum(ct->info))) {
    if ((ct->info & CTF_FP)) {
      if (ct->size == sizeof(double))
	return IRT_NUM;
      else if (ct->size == sizeof(float))
	return IRT_FLOAT;
    } else {
      uint32_t b = lj_fls(ct->size);
      if (b <= 3)
	return IRT_I8 + 2*b + ((ct->info & CTF_UNSIGNED) ? 1 : 0);
    }
  } else if (ctype_isptr(ct->info)) {
    return (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
  } else if (ctype_iscomplex(ct->info)) {
    if (ct->size == 2*sizeof(double))
      return IRT_NUM;
    else if (ct->size == 2*sizeof(float))
      return IRT_FLOAT;
  }
  return IRT_CDATA;
}